

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
::_reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
          *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer puVar3;
  long lVar4;
  const_iterator cVar5;
  iterator iVar6;
  int iVar7;
  Pos_index pairPos;
  __hashtable *__h;
  __hashtable *__h_1;
  ulong uVar8;
  pointer p;
  pointer puVar9;
  undefined8 *puVar10;
  Index IVar11;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainsInH;
  Tmp_column column;
  uint local_b4;
  pointer local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a8;
  anon_class_24_3_95756d54 local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  ID_index local_6c;
  ulong local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  uVar8 = (ulong)(uint)dim;
  local_6c = cellID;
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_60,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  puVar9 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (dim == -1) {
    if (puVar9 == puVar3) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)((int)((ulong)((long)puVar3 - (long)puVar9) >> 2) - 1);
    }
  }
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = __return_storage_ptr__;
  if (puVar9 != puVar3) {
    local_b0 = (pointer)CONCAT44(local_b0._4_4_,cellID);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_68 = uVar8;
    lVar4 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,*(undefined4 *)(lVar4 + 0x20));
    this_00 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(this + 0x68);
    cVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,(key_type *)&local_a0);
    if (cVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        != (__node_type *)0x0) {
      IVar11 = *(Index *)((long)cVar5.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                ._M_cur + 0xc);
      this_01 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(this + 0x30);
      while( true ) {
        local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,IVar11);
        iVar6 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this_01,(key_type *)&local_a0);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
            ._M_cur == (__node_type *)0x0) break;
        if (*(int *)((long)iVar6.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
                           ._M_cur + 0x18) == -1) {
          if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) goto LAB_00116a43;
          goto LAB_001169c6;
        }
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
        ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
                        *)this,(Tmp_column *)&local_60,&local_88,IVar11);
        if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
          local_b4 = (uint)local_b0;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_60,&local_b4);
          local_b0 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_00116c5e;
          puVar9 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          goto LAB_00116bf4;
        }
        lVar4 = std::_Rb_tree_decrement(&p_Var1->_M_header);
        local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,*(undefined4 *)(lVar4 + 0x20));
        cVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this_00,(key_type *)&local_a0);
        if (cVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) break;
        IVar11 = *(Index *)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 0xc);
      }
    }
    goto LAB_00116ce3;
  }
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_60,&local_6c);
  _container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            (this,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  &local_60,*(Index *)(this + 0xa0),(Dimension)uVar8);
  goto LAB_00116c7d;
  while( true ) {
    IVar11 = *(Index *)((long)cVar5.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              ._M_cur + 0xc);
    local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,IVar11);
    iVar6 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_01,(key_type *)&local_a0);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) goto LAB_00116ce3;
    if (*(int *)((long)iVar6.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
                       ._M_cur + 0x18) == -1) {
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
      ::_reduce_by_F((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
                      *)this,(Tmp_column *)&local_60,local_a8,IVar11);
    }
    else {
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
      ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
                      *)this,(Tmp_column *)&local_60,&local_88,IVar11);
    }
    if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) break;
LAB_001169c6:
    lVar4 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,*(undefined4 *)(lVar4 + 0x20));
    cVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,(key_type *)&local_a0);
    if (cVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) goto LAB_00116ce3;
  }
LAB_00116a43:
  puVar3 = (local_a8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = puVar3 + 1;
  if (puVar9 != (local_a8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    uVar2 = *puVar3;
    do {
      local_b4 = *puVar9;
      local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,uVar2);
      iVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_01,(key_type *)&local_a0);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_00116ce3;
      local_a0.col = (Column *)
                     ((long)iVar6.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
                            ._M_cur + 0x10);
      local_a0.sourceColumnIndex = &local_b4;
      local_a0.this =
           (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
            *)this;
      _add_to<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>::add_to(unsigned_int,unsigned_int)::_lambda()_1_>
                (this,local_a0.col,&local_a0);
      puVar9 = puVar9 + 1;
    } while (puVar9 != (local_a8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_b4 = (uint)local_b0;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_60,&local_b4);
  local_b0 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar9 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,*puVar9);
      iVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_01,(key_type *)&local_a0);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_00116ce3;
      for (puVar10 = *(undefined8 **)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
                             ._M_cur + 0x30);
          puVar10 !=
          (undefined8 *)
          ((long)iVar6.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
                 ._M_cur + 0x30); puVar10 = (undefined8 *)*puVar10) {
        if (puVar10 == (undefined8 *)0x0) goto LAB_00116cc4;
        local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,*(undefined4 *)(puVar10 + 2));
        pVar12 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_a0);
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_60,(_Base_ptr)pVar12.first._M_node);
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != local_b0);
  }
  uVar2 = *(local_a8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  _container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            (this,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  &local_60,*(Index *)(this + 0xa0),(Dimension)local_68);
  local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,*(int *)(this + 0xa0));
  iVar6 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_01,(key_type *)&local_a0);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
LAB_00116ce3:
    std::__throw_out_of_range("_Map_base::at");
  }
  *(uint *)((long)iVar6.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
                  ._M_cur + 0x18) = uVar2;
  local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,uVar2);
  iVar6 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_01,(key_type *)&local_a0);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) goto LAB_00116ce3;
  iVar7 = *(int *)(this + 0xa0);
  *(int *)((long)iVar6.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
                 ._M_cur + 0x18) = iVar7;
  goto LAB_00116c87;
LAB_00116bf4:
  do {
    local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,*puVar9);
    iVar6 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_01,(key_type *)&local_a0);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) goto LAB_00116ce3;
    for (puVar10 = *(undefined8 **)
                    ((long)iVar6.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
                           ._M_cur + 0x30);
        puVar10 !=
        (undefined8 *)
        ((long)iVar6.
               super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_false>
               ._M_cur + 0x30); puVar10 = (undefined8 *)*puVar10) {
      if (puVar10 == (undefined8 *)0x0) {
LAB_00116cc4:
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                      "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>::Matrix_column_tag, Type = 1]"
                     );
      }
      local_a0.col = (Column *)CONCAT44(local_a0.col._4_4_,*(undefined4 *)(puVar10 + 2));
      pVar12 = std::
               _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_a0);
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)&local_60,(_Base_ptr)pVar12.first._M_node);
      }
    }
    puVar9 = puVar9 + 1;
  } while (puVar9 != local_b0);
LAB_00116c5e:
  _container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            (this,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  &local_60,*(Index *)(this + 0xa0),(Dimension)local_68);
LAB_00116c7d:
  iVar7 = *(int *)(this + 0xa0);
LAB_00116c87:
  *(int *)(this + 0xa0) = iVar7 + 1;
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return local_a8;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}